

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headlossmodel.cpp
# Opt level: O2

void __thiscall
CM_HeadLossModel::findHeadLoss
          (CM_HeadLossModel *this,Pipe *pipe,double flow,double *headLoss,double *gradient)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = ABS(flow);
  dVar1 = pipe->lossFactor;
  dVar3 = (pipe->resistance + pipe->resistance) * dVar2;
  *gradient = dVar3;
  if (1e-06 <= dVar3) {
    dVar3 = dVar3 * dVar2 * 0.5;
  }
  else {
    *gradient = 1e-06;
    dVar3 = dVar2 * 1e-06;
  }
  *headLoss = dVar3;
  if (0.0 < dVar1) {
    *headLoss = dVar2 * dVar1 * dVar2 + dVar3;
    *gradient = (dVar1 + dVar1) * dVar2 + *gradient;
  }
  return;
}

Assistant:

void CM_HeadLossModel::findHeadLoss(
        Pipe* pipe, double flow, double& headLoss, double& gradient)
{
    double q = abs(flow);
    double r = pipe->resistance;
    double k = pipe->lossFactor;

    gradient = 2.0 * r * q;
    if ( gradient < MIN_GRADIENT )
    {
        gradient = MIN_GRADIENT;
        headLoss = q * gradient;
    }
    else headLoss = q * gradient / 2.0;
    if (k > 0.0)
    {
        headLoss += k * q * q;
        gradient += 2.0 * k * q;
   	}
}